

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

clock_t __thiscall lest::times::times(times *this,tms *__buffer)

{
  _Setfill<char> _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  undefined1 in_stack_00000008 [24];
  ostream *out_local;
  times *this_local;
  
  action::action(&this->super_action,(ostream *)__buffer);
  env::env(&this->output,(ostream *)__buffer,(options)in_stack_00000008);
  this->selected = 0;
  this->failures = 0;
  (this->total).start.__d.__r = 0;
  timer::timer(&this->total);
  poVar3 = (this->super_action).os;
  _Var1 = std::setfill<char>(' ');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
  _Var2 = std::setprecision(0);
  poVar3 = std::operator<<(poVar3,_Var2);
  return (clock_t)poVar3;
}

Assistant:

times( std::ostream & out, options option )
    : action( out ), output( out, option ), total()
    {
        os << std::setfill(' ') << std::fixed << std::setprecision( lest_FEATURE_TIME_PRECISION );
    }